

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O3

UniquePtr<SDL_Window> * __thiscall
solitaire::graphics::SDLGraphicsSystem::createSDLWindowOrQuitAndThrowError
          (UniquePtr<SDL_Window> *__return_storage_ptr__,SDLGraphicsSystem *this,string *title,
          uint width,uint height)

{
  undefined8 extraout_RAX;
  string local_38;
  
  (*((this->sdl)._M_t.
     super___uniq_ptr_impl<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
     ._M_t.
     super__Tuple_impl<0UL,_solitaire::SDL::interfaces::Wrapper_*,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
     .super__Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false>._M_head_impl)->
    _vptr_Wrapper[5])();
  if ((__return_storage_ptr__->_M_t).
      super___uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>._M_t.
      super__Tuple_impl<0UL,_SDL_Window_*,_std::function<void_(SDL_Window_*)>_>.
      super__Head_base<0UL,_SDL_Window_*,_false>._M_head_impl != (SDL_Window *)0x0) {
    return __return_storage_ptr__;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Cannot create window","");
  quitAndThrow(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr
            (__return_storage_ptr__);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

UniquePtr<SDL_Window> SDLGraphicsSystem::createSDLWindowOrQuitAndThrowError(
    const std::string& title, const unsigned width, const unsigned height)
{
    auto window = sdl->createWindow(
        title, SDL_WINDOWPOS_UNDEFINED, SDL_WINDOWPOS_UNDEFINED,
        width, height, SDL_WINDOW_SHOWN
    );

    if (not window)
        quitAndThrow("Cannot create window");
    return window;
}